

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O1

void Bac_ManWriteVerilog(char *pFileName,Bac_Man_t *p,int fUseAssign)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  Vec_Str_t *pVVar6;
  char *pcVar7;
  Vec_Str_t *pVVar8;
  char *pcVar9;
  FILE *__s;
  ulong uVar10;
  int i_1;
  size_t sVar11;
  size_t sVar12;
  int i;
  long lVar13;
  long lVar14;
  
  pvVar4 = p->pMioLib;
  if ((pvVar4 != (void *)0x0) && (pvVar5 = Abc_FrameReadLibGen(), pvVar4 != pvVar5)) {
    puts("Genlib library used in the mapped design is not longer a current library.");
    return;
  }
  pVVar6 = (Vec_Str_t *)malloc(0x10);
  pVVar6->nCap = 10000;
  pVVar6->nSize = 0;
  pcVar7 = (char *)malloc(10000);
  pVVar6->pArray = pcVar7;
  p->vOut = pVVar6;
  pVVar8 = (Vec_Str_t *)malloc(0x10);
  pVVar8->nCap = 1000;
  pVVar8->nSize = 0;
  pcVar7 = (char *)malloc(1000);
  pVVar8->pArray = pcVar7;
  p->vOut2 = pVVar8;
  lVar13 = 0;
  do {
    cVar1 = "// Design \""[lVar13];
    uVar2 = pVVar6->nCap;
    if (pVVar6->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (pVVar6->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(0x10);
        }
        else {
          pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
        }
        sVar11 = 0x10;
      }
      else {
        sVar11 = (ulong)uVar2 * 2;
        if ((int)sVar11 <= (int)uVar2) goto LAB_00326b01;
        if (pVVar6->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(sVar11);
        }
        else {
          pcVar7 = (char *)realloc(pVVar6->pArray,sVar11);
        }
      }
      pVVar6->pArray = pcVar7;
      pVVar6->nCap = (int)sVar11;
    }
LAB_00326b01:
    iVar3 = pVVar6->nSize;
    pVVar6->nSize = iVar3 + 1;
    pVVar6->pArray[iVar3] = cVar1;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0xb);
  pcVar7 = p->pName;
  pVVar6 = p->vOut;
  sVar11 = strlen(pcVar7);
  if (0 < (int)(uint)sVar11) {
    uVar10 = 0;
    do {
      cVar1 = pcVar7[uVar10];
      uVar2 = pVVar6->nCap;
      if (pVVar6->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar6->pArray == (char *)0x0) {
            pcVar9 = (char *)malloc(0x10);
          }
          else {
            pcVar9 = (char *)realloc(pVVar6->pArray,0x10);
          }
          sVar12 = 0x10;
        }
        else {
          sVar12 = (ulong)uVar2 * 2;
          if ((int)sVar12 <= (int)uVar2) goto LAB_00326bae;
          if (pVVar6->pArray == (char *)0x0) {
            pcVar9 = (char *)malloc(sVar12);
          }
          else {
            pcVar9 = (char *)realloc(pVVar6->pArray,sVar12);
          }
        }
        pVVar6->pArray = pcVar9;
        pVVar6->nCap = (int)sVar12;
      }
LAB_00326bae:
      iVar3 = pVVar6->nSize;
      pVVar6->nSize = iVar3 + 1;
      pVVar6->pArray[iVar3] = cVar1;
      uVar10 = uVar10 + 1;
    } while (((uint)sVar11 & 0x7fffffff) != uVar10);
  }
  pVVar6 = p->vOut;
  lVar13 = 0;
  do {
    cVar1 = "\" written via CBA package in ABC on "[lVar13];
    uVar2 = pVVar6->nCap;
    if (pVVar6->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (pVVar6->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(0x10);
        }
        else {
          pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
        }
        sVar11 = 0x10;
      }
      else {
        sVar11 = (ulong)uVar2 * 2;
        if ((int)sVar11 <= (int)uVar2) goto LAB_00326c43;
        if (pVVar6->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(sVar11);
        }
        else {
          pcVar7 = (char *)realloc(pVVar6->pArray,sVar11);
        }
      }
      pVVar6->pArray = pcVar7;
      pVVar6->nCap = (int)sVar11;
    }
LAB_00326c43:
    iVar3 = pVVar6->nSize;
    pVVar6->nSize = iVar3 + 1;
    pVVar6->pArray[iVar3] = cVar1;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x24);
  pVVar6 = p->vOut;
  pcVar7 = Extra_TimeStamp();
  sVar11 = strlen(pcVar7);
  if (0 < (int)(uint)sVar11) {
    uVar10 = 0;
    do {
      cVar1 = pcVar7[uVar10];
      uVar2 = pVVar6->nCap;
      if (pVVar6->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar6->pArray == (char *)0x0) {
            pcVar9 = (char *)malloc(0x10);
          }
          else {
            pcVar9 = (char *)realloc(pVVar6->pArray,0x10);
          }
          sVar12 = 0x10;
        }
        else {
          sVar12 = (ulong)uVar2 * 2;
          if ((int)sVar12 <= (int)uVar2) goto LAB_00326cf2;
          if (pVVar6->pArray == (char *)0x0) {
            pcVar9 = (char *)malloc(sVar12);
          }
          else {
            pcVar9 = (char *)realloc(pVVar6->pArray,sVar12);
          }
        }
        pVVar6->pArray = pcVar9;
        pVVar6->nCap = (int)sVar12;
      }
LAB_00326cf2:
      iVar3 = pVVar6->nSize;
      pVVar6->nSize = iVar3 + 1;
      pVVar6->pArray[iVar3] = cVar1;
      uVar10 = uVar10 + 1;
    } while (((uint)sVar11 & 0x7fffffff) != uVar10);
  }
  pVVar6 = p->vOut;
  lVar13 = 0;
  do {
    cVar1 = ".end\n\n\n"[lVar13 + 5];
    uVar2 = pVVar6->nCap;
    if (pVVar6->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (pVVar6->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(0x10);
        }
        else {
          pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
        }
        sVar11 = 0x10;
      }
      else {
        sVar11 = (ulong)uVar2 * 2;
        if ((int)sVar11 <= (int)uVar2) goto LAB_00326d87;
        if (pVVar6->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(sVar11);
        }
        else {
          pcVar7 = (char *)realloc(pVVar6->pArray,sVar11);
        }
      }
      pVVar6->pArray = pcVar7;
      pVVar6->nCap = (int)sVar11;
    }
LAB_00326d87:
    iVar3 = pVVar6->nSize;
    pVVar6->nSize = iVar3 + 1;
    pVVar6->pArray[iVar3] = cVar1;
    lVar13 = lVar13 + 1;
    if (lVar13 == 2) {
      Bac_ManAssignInternWordNames(p);
      if (0 < p->nNtks) {
        lVar13 = 0xd0;
        lVar14 = 0;
        do {
          Bac_ManWriteVerilogNtk((Bac_Ntk_t *)((long)&p->pNtks->pDesign + lVar13),fUseAssign);
          lVar14 = lVar14 + 1;
          lVar13 = lVar13 + 0xd0;
        } while (lVar14 < p->nNtks);
      }
      if ((p->vOut != (Vec_Str_t *)0x0) && (0 < p->vOut->nSize)) {
        __s = fopen(pFileName,"wb");
        if (__s == (FILE *)0x0) {
          printf("Cannot open file \"%s\" for writing.\n",pFileName);
        }
        else {
          fwrite(p->vOut->pArray,1,(long)p->vOut->nSize,__s);
          fclose(__s);
        }
      }
      if (p->vOut != (Vec_Str_t *)0x0) {
        pcVar7 = p->vOut->pArray;
        if (pcVar7 != (char *)0x0) {
          free(pcVar7);
          p->vOut->pArray = (char *)0x0;
        }
        if (p->vOut != (Vec_Str_t *)0x0) {
          free(p->vOut);
          p->vOut = (Vec_Str_t *)0x0;
        }
      }
      if (p->vOut2 != (Vec_Str_t *)0x0) {
        pcVar7 = p->vOut2->pArray;
        if (pcVar7 != (char *)0x0) {
          free(pcVar7);
          p->vOut2->pArray = (char *)0x0;
        }
        if (p->vOut2 != (Vec_Str_t *)0x0) {
          free(p->vOut2);
          p->vOut2 = (Vec_Str_t *)0x0;
        }
      }
      return;
    }
  } while( true );
}

Assistant:

void Bac_ManWriteVerilog( char * pFileName, Bac_Man_t * p, int fUseAssign )
{
    Bac_Ntk_t * pNtk; int i;
    // check the library
    if ( p->pMioLib && p->pMioLib != Abc_FrameReadLibGen() )
    {
        printf( "Genlib library used in the mapped design is not longer a current library.\n" );
        return;
    }
    // derive the stream
    p->vOut = Vec_StrAlloc( 10000 );
    p->vOut2 = Vec_StrAlloc( 1000 );
    Vec_StrPrintStr( p->vOut, "// Design \"" );
    Vec_StrPrintStr( p->vOut, Bac_ManName(p) );
    Vec_StrPrintStr( p->vOut, "\" written via CBA package in ABC on " );
    Vec_StrPrintStr( p->vOut, Extra_TimeStamp() );
    Vec_StrPrintStr( p->vOut, "\n\n" );
    Bac_ManAssignInternWordNames( p );
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_ManWriteVerilogNtk( pNtk, fUseAssign );
    // dump into file
    if ( p->vOut && Vec_StrSize(p->vOut) > 0 )
    {
        FILE * pFile = fopen( pFileName, "wb" );
        if ( pFile == NULL )
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        else
        {
            fwrite( Vec_StrArray(p->vOut), 1, Vec_StrSize(p->vOut), pFile );
            fclose( pFile );
        }
    }
    Vec_StrFreeP( &p->vOut );
    Vec_StrFreeP( &p->vOut2 );
}